

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_size_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  char cVar1;
  int iVar2;
  CURLcode CVar3;
  char *pcVar4;
  char *pcVar5;
  char *__s;
  curl_off_t filesize;
  char clbuf [128];
  curl_off_t local_a0;
  char local_98 [128];
  
  local_a0 = -1;
  if (ftpcode == 0xd5) {
    __s = (data->state).buffer + 4;
    pcVar4 = strchr(__s,0xd);
    if (pcVar4 != (char *)0x0) {
      pcVar4 = pcVar4 + -1;
      do {
        cVar1 = *pcVar4;
        pcVar5 = pcVar4 + -1;
        if (pcVar4 <= __s) break;
        pcVar4 = pcVar5;
      } while ((byte)(cVar1 - 0x30U) < 10);
      __s = pcVar5 + (2 - (ulong)((byte)(cVar1 - 0x30U) < 10));
    }
    curlx_strtoofft(__s,(char **)0x0,0,&local_a0);
  }
  else if (instate != FTP_STOR_SIZE && ftpcode == 0x226) {
    Curl_failf(data,"The file does not exist");
    return CURLE_REMOTE_FILE_NOT_FOUND;
  }
  if (instate == FTP_STOR_SIZE) {
    (data->state).resume_from = local_a0;
    CVar3 = ftp_state_ul_setup(data,true);
  }
  else if (instate == FTP_RETR_SIZE) {
    Curl_pgrsSetDownloadSize(data,local_a0);
    CVar3 = ftp_state_retr(data,local_a0);
  }
  else {
    CVar3 = CURLE_OK;
    if (instate == FTP_SIZE) {
      if (local_a0 != -1) {
        iVar2 = curl_msnprintf(local_98,0x80,"Content-Length: %ld\r\n");
        CVar3 = Curl_client_write(data,3,local_98,(long)iVar2);
        if (CVar3 != CURLE_OK) {
          return CVar3;
        }
      }
      Curl_pgrsSetDownloadSize(data,local_a0);
      CVar3 = ftp_state_rest(data,data->conn);
    }
  }
  return CVar3;
}

Assistant:

static CURLcode ftp_state_size_resp(struct Curl_easy *data,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  curl_off_t filesize = -1;
  char *buf = data->state.buffer;

  /* get the size from the ascii string: */
  if(ftpcode == 213) {
    /* To allow servers to prepend "rubbish" in the response string, we scan
       for all the digits at the end of the response and parse only those as a
       number. */
    char *start = &buf[4];
    char *fdigit = strchr(start, '\r');
    if(fdigit) {
      do
        fdigit--;
      while(ISDIGIT(*fdigit) && (fdigit > start));
      if(!ISDIGIT(*fdigit))
        fdigit++;
    }
    else
      fdigit = start;
    /* ignores parsing errors, which will make the size remain unknown */
    (void)curlx_strtoofft(fdigit, NULL, 0, &filesize);

  }
  else if(ftpcode == 550) { /* "No such file or directory" */
    /* allow a SIZE failure for (resumed) uploads, when probing what command
       to use */
    if(instate != FTP_STOR_SIZE) {
      failf(data, "The file does not exist");
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
  }

  if(instate == FTP_SIZE) {
#ifdef CURL_FTP_HTTPSTYLE_HEAD
    if(-1 != filesize) {
      char clbuf[128];
      int clbuflen = msnprintf(clbuf, sizeof(clbuf),
                "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n", filesize);
      result = Curl_client_write(data, CLIENTWRITE_BOTH, clbuf, clbuflen);
      if(result)
        return result;
    }
#endif
    Curl_pgrsSetDownloadSize(data, filesize);
    result = ftp_state_rest(data, data->conn);
  }
  else if(instate == FTP_RETR_SIZE) {
    Curl_pgrsSetDownloadSize(data, filesize);
    result = ftp_state_retr(data, filesize);
  }
  else if(instate == FTP_STOR_SIZE) {
    data->state.resume_from = filesize;
    result = ftp_state_ul_setup(data, TRUE);
  }

  return result;
}